

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconsStamp.cpp
# Opt level: O0

void __thiscall OpenMD::ZConsStamp::~ZConsStamp(ZConsStamp *this)

{
  ZConsStamp *in_RDI;
  
  ~ZConsStamp(in_RDI);
  operator_delete(in_RDI,0x140);
  return;
}

Assistant:

ZConsStamp::~ZConsStamp() {}